

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O0

void __thiscall
t_d_generator::generate_consts
          (t_d_generator *this,vector<t_const_*,_std::allocator<t_const_*>_> *consts)

{
  t_type *type_00;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  t_program *program;
  reference pptVar4;
  t_const_value *value;
  int __oflag;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  t_type *local_330;
  t_type *type_1;
  t_const **local_320;
  byte local_311;
  undefined1 local_310 [7];
  bool first;
  t_type *local_2f0;
  t_type *type;
  undefined1 local_2c8 [8];
  string name;
  __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_> local_298;
  iterator c_iter;
  string local_270;
  string local_250 [39];
  allocator local_229;
  string local_228 [32];
  undefined1 local_208 [8];
  ofstream_with_content_based_conditional_update f_consts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string f_consts_name;
  vector<t_const_*,_std::allocator<t_const_*>_> *consts_local;
  t_d_generator *this_local;
  
  f_consts_name.field_2._8_8_ = consts;
  bVar1 = std::vector<t_const_*,_std::allocator<t_const_*>_>::empty(consts);
  if (!bVar1) {
    std::operator+(&local_58,&this->package_dir_,
                   &(this->super_t_oop_generator).super_t_generator.program_name_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   &local_58,"_constants.d");
    std::__cxx11::string::~string((string *)&local_58);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    template_ofstream_with_content_based_conditional_update
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_208);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_228,pcVar2,&local_229);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_208,(char *)local_228,__oflag);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_250);
    poVar3 = std::operator<<((ostream *)local_208,local_250);
    poVar3 = std::operator<<(poVar3,"module ");
    render_package_abi_cxx11_
              (&local_270,this,(this->super_t_oop_generator).super_t_generator.program_);
    poVar3 = std::operator<<(poVar3,(string *)&local_270);
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.program_name_);
    poVar3 = std::operator<<(poVar3,"_constants;");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string(local_250);
    print_default_imports(this,(ostream *)local_208);
    poVar3 = std::operator<<((ostream *)local_208,"import ");
    program = t_generator::get_program((t_generator *)this);
    render_package_abi_cxx11_((string *)&c_iter,this,program);
    poVar3 = std::operator<<(poVar3,(string *)&c_iter);
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_t_oop_generator).super_t_generator.program_name_);
    poVar3 = std::operator<<(poVar3,"_types;");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&c_iter);
    __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
    __normal_iterator(&local_298);
    local_298._M_current =
         (t_const **)std::vector<t_const_*,_std::allocator<t_const_*>_>::begin(consts);
    while( true ) {
      name.field_2._8_8_ = std::vector<t_const_*,_std::allocator<t_const_*>_>::end(consts);
      bVar1 = __gnu_cxx::operator!=
                        (&local_298,
                         (__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
                          *)((long)&name.field_2 + 8));
      if (!bVar1) break;
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&local_298);
      emit_doc(this,&(*pptVar4)->super_t_doc,(ostream *)local_208);
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&local_298);
      t_const::get_name_abi_cxx11_((string *)&type,*pptVar4);
      suffix_if_reserved((string *)local_2c8,(string *)&type);
      std::__cxx11::string::~string((string *)&type);
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&local_298);
      local_2f0 = t_const::get_type(*pptVar4);
      poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_208);
      poVar3 = std::operator<<(poVar3,"immutable(");
      render_type_name_abi_cxx11_((string *)local_310,this,local_2f0,false);
      poVar3 = std::operator<<(poVar3,(string *)local_310);
      poVar3 = std::operator<<(poVar3,") ");
      poVar3 = std::operator<<(poVar3,(string *)local_2c8);
      poVar3 = std::operator<<(poVar3,";");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)local_310);
      std::__cxx11::string::~string((string *)local_2c8);
      __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
      ::operator++(&local_298);
    }
    poVar3 = std::operator<<((ostream *)local_208,(string *)&::endl_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"shared static this() {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    local_311 = 1;
    local_320 = (t_const **)std::vector<t_const_*,_std::allocator<t_const_*>_>::begin(consts);
    local_298._M_current = local_320;
    while( true ) {
      type_1 = (t_type *)std::vector<t_const_*,_std::allocator<t_const_*>_>::end(consts);
      bVar1 = __gnu_cxx::operator!=
                        (&local_298,
                         (__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
                          *)&type_1);
      if (!bVar1) break;
      if ((local_311 & 1) == 0) {
        std::operator<<((ostream *)local_208,(string *)&::endl_abi_cxx11_);
      }
      else {
        local_311 = 0;
      }
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&local_298);
      local_330 = t_const::get_type(*pptVar4);
      poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_208);
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&local_298);
      t_const::get_name_abi_cxx11_(&local_370,*pptVar4);
      suffix_if_reserved(&local_350,&local_370);
      poVar3 = std::operator<<(poVar3,(string *)&local_350);
      std::operator<<(poVar3," = ");
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_370);
      bVar1 = is_immutable_type(this,local_330);
      if (!bVar1) {
        poVar3 = std::operator<<((ostream *)local_208,"cast(immutable(");
        render_type_name_abi_cxx11_(&local_390,this,local_330,false);
        poVar3 = std::operator<<(poVar3,(string *)&local_390);
        std::operator<<(poVar3,")) ");
        std::__cxx11::string::~string((string *)&local_390);
      }
      type_00 = local_330;
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>::
                operator*(&local_298);
      value = t_const::get_value(*pptVar4);
      render_const_value_abi_cxx11_(&local_3b0,this,type_00,value);
      poVar3 = std::operator<<((ostream *)local_208,(string *)&local_3b0);
      poVar3 = std::operator<<(poVar3,";");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_3b0);
      __gnu_cxx::__normal_iterator<t_const_**,_std::vector<t_const_*,_std::allocator<t_const_*>_>_>
      ::operator++(&local_298);
    }
    t_generator::indent_down((t_generator *)this);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_208);
    poVar3 = std::operator<<(poVar3,"}");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    ~template_ofstream_with_content_based_conditional_update
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)local_208);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void generate_consts(std::vector<t_const*> consts) override {
    if (!consts.empty()) {
      string f_consts_name = package_dir_ + program_name_ + "_constants.d";
      ofstream_with_content_based_conditional_update f_consts;
      f_consts.open(f_consts_name.c_str());

      f_consts << autogen_comment() << "module " << render_package(*program_) << program_name_
               << "_constants;" << endl << endl;

      print_default_imports(f_consts);

      f_consts << "import " << render_package(*get_program()) << program_name_ << "_types;" << endl
               << endl;

      vector<t_const*>::iterator c_iter;
      for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
        this->emit_doc(*c_iter, f_consts);
        string name = suffix_if_reserved((*c_iter)->get_name());
        t_type* type = (*c_iter)->get_type();
        indent(f_consts) << "immutable(" << render_type_name(type) << ") " << name << ";" << endl;
      }

      f_consts << endl << "shared static this() {" << endl;
      indent_up();

      bool first = true;
      for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
        if (first) {
          first = false;
        } else {
          f_consts << endl;
        }
        t_type* type = (*c_iter)->get_type();
        indent(f_consts) << suffix_if_reserved((*c_iter)->get_name()) << " = ";
        if (!is_immutable_type(type)) {
          f_consts << "cast(immutable(" << render_type_name(type) << ")) ";
        }
        f_consts << render_const_value(type, (*c_iter)->get_value()) << ";" << endl;
      }
      indent_down();
      indent(f_consts) << "}" << endl;
    }
  }